

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_avx2.c
# Opt level: O2

void accumulate_sse_sum(__m256i regx_sum,__m256i regx2_sum,int *x_sum,int64_t *x2_sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  
  auVar1 = vpaddq_avx(in_ZMM1._16_16_,in_ZMM1._0_16_);
  auVar2 = vphaddd_avx(in_ZMM0._16_16_,in_ZMM0._0_16_);
  auVar3 = vpshufd_avx(auVar1,0xee);
  auVar2 = vphaddd_avx(auVar2,auVar2);
  auVar2 = vphaddd_avx(auVar2,auVar2);
  *x_sum = *x_sum + auVar2._0_4_;
  auVar1 = vpaddq_avx(auVar1,auVar3);
  *x2_sum = *x2_sum + auVar1._0_8_;
  return;
}

Assistant:

static inline void accumulate_sse_sum(__m256i regx_sum, __m256i regx2_sum,
                                      int *x_sum, int64_t *x2_sum) {
  __m256i sum_buffer, sse_buffer;
  __m128i out_buffer;

  // Accumulate the various elements of register into first element.
  sum_buffer = _mm256_permute2f128_si256(regx_sum, regx_sum, 1);
  regx_sum = _mm256_add_epi32(sum_buffer, regx_sum);
  regx_sum = _mm256_add_epi32(regx_sum, _mm256_srli_si256(regx_sum, 8));
  regx_sum = _mm256_add_epi32(regx_sum, _mm256_srli_si256(regx_sum, 4));

  sse_buffer = _mm256_permute2f128_si256(regx2_sum, regx2_sum, 1);
  regx2_sum = _mm256_add_epi64(sse_buffer, regx2_sum);
  regx2_sum = _mm256_add_epi64(regx2_sum, _mm256_srli_si256(regx2_sum, 8));

  out_buffer = _mm256_castsi256_si128(regx_sum);
  *x_sum += _mm_cvtsi128_si32(out_buffer);
  out_buffer = _mm256_castsi256_si128(regx2_sum);
#if AOM_ARCH_X86_64
  *x2_sum += _mm_cvtsi128_si64(out_buffer);
#else
  {
    int64_t tmp;
    _mm_storel_epi64((__m128i *)&tmp, out_buffer);
    *x2_sum += tmp;
  }
#endif
}